

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QRomanCalendar::standaloneMonthName
          (QString *__return_storage_ptr__,QRomanCalendar *this,QLocale *locale,int month,int year,
          FormatType format)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((locale->d).d.ptr)->m_data == &systemLocaleData) {
    uVar3 = 0x2c;
    if (format != NarrowFormat) {
      uVar3 = format == ShortFormat | 0x2a;
    }
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    ::QVariant::QVariant(&local_78,month);
    (*pQVar2->_vptr_QSystemLocale[2])(&local_58,pQVar2,(ulong)uVar3,&local_78);
    ::QVariant::~QVariant(&local_78);
    bVar1 = ::QVariant::isNull((QVariant *)&local_58);
    if (bVar1) {
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (!bVar1) goto LAB_003151bd;
    }
  }
  QCalendarBackend::standaloneMonthName
            (__return_storage_ptr__,&this->super_QCalendarBackend,locale,month,year,format);
LAB_003151bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QRomanCalendar::standaloneMonthName(const QLocale &locale, int month, int year,
                                            QLocale::FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (locale.d->m_data == &systemLocaleData) {
        Q_ASSERT(month >= 1 && month <= 12);
        QSystemLocale::QueryType queryType = QSystemLocale::StandaloneMonthNameLong;
        switch (format) {
        case QLocale::LongFormat:
            queryType = QSystemLocale::StandaloneMonthNameLong;
            break;
        case QLocale::ShortFormat:
            queryType = QSystemLocale::StandaloneMonthNameShort;
            break;
        case QLocale::NarrowFormat:
            queryType = QSystemLocale::StandaloneMonthNameNarrow;
            break;
        }
        QVariant res = systemLocale()->query(queryType, month);
        if (!res.isNull())
            return res.toString();
    }
#endif

    return QCalendarBackend::standaloneMonthName(locale, month, year, format);
}